

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeSetEtaMaxEarlyStep(void *cvode_mem,realtype eta_max_es)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetEtaMaxEarlyStep","cvode_mem = NULL illegal."
                  );
  }
  else {
    if (eta_max_es <= 1.0) {
      *(undefined8 *)((long)cvode_mem + 0x318) = 0x4024000000000000;
    }
    else {
      *(realtype *)((long)cvode_mem + 0x318) = eta_max_es;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetEtaMaxEarlyStep(void* cvode_mem, realtype eta_max_es)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetEtaMaxEarlyStep",
                   MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* set allowed value or use default */
  if (eta_max_es <= ONE)
    cv_mem->cv_eta_max_es = ETA_MAX_ES_DEFAULT;
  else
    cv_mem->cv_eta_max_es = eta_max_es;

  return(CV_SUCCESS);
}